

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O2

int Llb_ManComputeCommonQuant(Llb_Mtr_t *p,int iCol1,int iCol2)

{
  char **ppcVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar4 = p->nRows - p->nFfs;
  uVar6 = 0;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar6;
  }
  iVar3 = 0;
  do {
    if (uVar5 == uVar6) {
      return iVar3;
    }
    ppcVar1 = p->pMatrix;
    iVar2 = iVar3;
    if (ppcVar1[iCol1][uVar6] == '\0') {
      if (ppcVar1[iCol2][uVar6] == '\x01') {
LAB_0065b3dd:
        iVar2 = iVar3 + -1;
      }
    }
    else if (ppcVar1[iCol1][uVar6] == '\x01') {
      if (ppcVar1[iCol2][uVar6] == '\0') goto LAB_0065b3dd;
      if ((ppcVar1[iCol2][uVar6] == '\x01') && (iVar2 = iVar3 + 2, p->pRowSums[uVar6] != 2)) {
        iVar2 = iVar3;
      }
    }
    iVar3 = iVar2;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Llb_ManComputeCommonQuant( Llb_Mtr_t * p, int iCol1, int iCol2 )
{
    int iVar, Weight = 0;
    for ( iVar = 0; iVar < p->nRows - p->nFfs; iVar++ )
    {
        // count each removed variable as 2
        if ( p->pMatrix[iCol1][iVar] == 1 && p->pMatrix[iCol2][iVar] == 1 && p->pRowSums[iVar] == 2 )
            Weight += 2;
        // count each added variale as -1
        else if ( (p->pMatrix[iCol1][iVar] == 1 && p->pMatrix[iCol2][iVar] == 0) || 
                  (p->pMatrix[iCol1][iVar] == 0 && p->pMatrix[iCol2][iVar] == 1) )
            Weight--;
    }
    return Weight;
}